

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O1

void ryg_dxt::sCompressDXTBlock(sU8 *dest,sU32 *src,sBool alpha,sInt quality)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int *piVar7;
  sInt i_2;
  sU32 sVar8;
  sU32 *psVar9;
  long lVar10;
  int *piVar11;
  uint uVar12;
  uint uVar13;
  undefined7 in_register_00000011;
  int iVar14;
  int iVar15;
  ushort uVar16;
  int iVar17;
  int *piVar18;
  ulong uVar19;
  sInt i_4;
  sU32 *psVar20;
  uint uVar21;
  undefined1 *puVar22;
  sInt i_1;
  uint uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  ushort uVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  bool bVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  sInt err [8];
  sInt max [3];
  sInt min [3];
  sInt mu [3];
  sF32 covf [6];
  Pixel dblock [16];
  uint local_104;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_e8 [7];
  uint local_cc;
  Pixel *local_c8;
  uint local_bc [6];
  uint local_a4 [3];
  float local_98 [6];
  ushort *local_80;
  sU32 local_78 [18];
  
  if ((int)CONCAT71(in_register_00000011,alpha) != 0) {
    CompressAlphaBlock(dest,src);
    dest = dest + 8;
  }
  uVar34 = *src;
  lVar10 = 1;
  uVar13 = uVar34;
  do {
    uVar12 = src[lVar10];
    if (uVar12 <= uVar34) {
      uVar34 = uVar12;
    }
    if (uVar12 < uVar13) {
      uVar12 = uVar13;
    }
    uVar13 = uVar12;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  if (uVar34 == uVar13) {
    uVar27 = (ushort)(byte)OMatch5[(ulong)(byte)*src * 2] |
             (ushort)(byte)OMatch6[(ulong)*(byte *)((long)src + 1) * 2] << 5 |
             (ushort)(byte)OMatch5[(ulong)*(byte *)((long)src + 2) * 2] << 0xb;
    uVar16 = (ushort)(byte)OMatch5[(ulong)(byte)*src * 2 + 1] |
             (ushort)(byte)OMatch6[(ulong)*(byte *)((long)src + 1) * 2 + 1] << 5 |
             (ushort)(byte)OMatch5[(ulong)*(byte *)((long)src + 2) * 2 + 1] << 0xb;
    uVar34 = 0xaaaaaaaa;
    goto LAB_00196688;
  }
  psVar9 = src;
  if (quality != 0) {
    piVar11 = (int *)&local_f8;
    psVar9 = local_78;
    piVar18 = local_e8;
    lVar10 = 0;
    psVar20 = src;
    do {
      puVar22 = &QuantRBTab;
      if (lVar10 == 1) {
        puVar22 = &QuantGTab;
      }
      local_e8[0] = 0;
      local_e8[1] = 0;
      local_e8[2] = 0;
      local_e8[3] = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      lVar26 = 0;
      piVar7 = piVar11;
      do {
        piVar11 = piVar18;
        piVar18 = piVar7;
        bVar1 = *(byte *)((long)psVar20 + lVar26);
        bVar2 = puVar22[(long)(*piVar11 * 5 + piVar11[1] * 3 >> 4) + (ulong)bVar1 + 8];
        *(byte *)((long)psVar9 + lVar26) = bVar2;
        iVar14 = (uint)bVar1 - (uint)bVar2;
        *piVar18 = iVar14;
        bVar1 = *(byte *)((long)psVar20 + lVar26 + 4);
        bVar2 = puVar22[(long)(piVar11[1] * 5 + piVar11[2] * 3 + iVar14 * 7 + *piVar11 >> 4) +
                        (ulong)bVar1 + 8];
        *(byte *)((long)psVar9 + lVar26 + 4) = bVar2;
        iVar14 = (uint)bVar1 - (uint)bVar2;
        piVar18[1] = iVar14;
        bVar1 = *(byte *)((long)psVar20 + lVar26 + 8);
        bVar2 = puVar22[(long)(piVar11[2] * 5 + piVar11[3] * 3 + iVar14 * 7 + piVar11[1] >> 4) +
                        (ulong)bVar1 + 8];
        *(byte *)((long)psVar9 + lVar26 + 8) = bVar2;
        iVar14 = (uint)bVar1 - (uint)bVar2;
        piVar18[2] = iVar14;
        bVar1 = *(byte *)((long)psVar20 + lVar26 + 0xc);
        bVar2 = puVar22[(long)(piVar11[3] * 5 + iVar14 * 7 + piVar11[2] >> 4) + (ulong)bVar1 + 8];
        *(byte *)((long)psVar9 + lVar26 + 0xc) = bVar2;
        piVar18[3] = (uint)bVar1 - (uint)bVar2;
        lVar26 = lVar26 + 0x10;
        piVar7 = piVar11;
      } while ((int)lVar26 != 0x40);
      lVar10 = lVar10 + 1;
      psVar9 = (sU32 *)((long)psVar9 + 1);
      psVar20 = (sU32 *)((long)psVar20 + 1);
    } while (lVar10 != 3);
    psVar9 = local_78;
  }
  psVar20 = psVar9 + 1;
  lVar10 = 0;
  do {
    uVar12 = (uint)*(byte *)((long)psVar9 + lVar10);
    uVar19 = 0;
    uVar34 = (uint)*(byte *)((long)psVar9 + lVar10);
    uVar13 = uVar34;
    do {
      bVar1 = *(byte *)((long)psVar20 + uVar19);
      uVar12 = uVar12 + bVar1;
      uVar21 = (uint)bVar1;
      if (uVar21 <= uVar34) {
        uVar34 = uVar21;
      }
      uVar23 = (uint)bVar1;
      if (uVar21 < uVar13) {
        uVar23 = uVar13;
      }
      uVar13 = uVar23;
      uVar19 = uVar19 + 4;
    } while (uVar19 < 0x3c);
    local_bc[lVar10 + 6] = uVar12 + 8 >> 4;
    local_bc[lVar10 + 3] = uVar34;
    local_bc[lVar10] = uVar13;
    lVar10 = lVar10 + 1;
    psVar20 = (sU32 *)((long)psVar20 + 1);
  } while (lVar10 != 3);
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8[0] = 0;
  local_e8[1] = 0;
  local_f8._0_4_ = 0;
  local_f8._4_4_ = 0;
  uStack_f0._0_4_ = 0;
  uStack_f0._4_4_ = 0;
  lVar10 = 0;
  local_e8[1] = 0;
  local_e8[0] = 0;
  iVar14 = uStack_f0._4_4_;
  do {
    iVar31 = *(byte *)((long)psVar9 + lVar10 * 4 + 2) - local_a4[2];
    iVar33 = *(byte *)((long)psVar9 + lVar10 * 4 + 1) - local_a4[1];
    iVar28 = (byte)psVar9[lVar10] - local_a4[0];
    local_f8._0_4_ = local_f8._0_4_ + iVar31 * iVar31;
    local_f8._4_4_ = local_f8._4_4_ + iVar33 * iVar31;
    uStack_f0._0_4_ = (uint)uStack_f0 + iVar31 * iVar28;
    uVar34 = iVar33 * iVar33;
    iVar14 = iVar14 + uVar34;
    local_e8[0] = local_e8[0] + iVar28 * iVar33;
    local_e8[1] = local_e8[1] + iVar28 * iVar28;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  uStack_f0 = CONCAT44(iVar14,(uint)uStack_f0);
  lVar10 = 0;
  do {
    local_98[lVar10] = (float)*(int *)((long)&local_f8 + lVar10 * 4) / 255.0;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  fVar40 = (float)(int)(local_bc[1] - local_bc[4]);
  fVar37 = (float)(int)(local_bc[0] - local_bc[3]);
  iVar28 = 4;
  fVar38 = (float)(int)(local_bc[2] - local_bc[5]);
  do {
    fVar39 = fVar37 * local_98[2] + fVar38 * local_98[0] + local_98[1] * fVar40;
    fVar41 = fVar40 * local_98[4];
    fVar40 = fVar37 * local_98[4] + fVar38 * local_98[1] + local_98[3] * fVar40;
    fVar37 = fVar37 * local_98[5] + fVar38 * local_98[2] + fVar41;
    iVar28 = iVar28 + -1;
    fVar38 = fVar39;
  } while (iVar28 != 0);
  fVar38 = ABS(fVar39);
  if (ABS(fVar39) <= ABS(fVar40)) {
    fVar38 = ABS(fVar40);
  }
  if (fVar38 <= ABS(fVar37)) {
    fVar38 = ABS(fVar37);
  }
  if (4.0 <= fVar38) {
    fVar38 = 512.0 / fVar38;
    uVar13 = (uint)(fVar39 * fVar38);
    iVar28 = (int)(fVar40 * fVar38);
    iVar31 = (int)(fVar37 * fVar38);
    local_104 = uVar13;
  }
  else {
    iVar31 = 0x3a;
    iVar28 = 300;
    local_104 = 0x94;
    uVar13 = 0;
  }
  iVar33 = 0x7fffffff;
  iVar24 = -0x7fffffff;
  lVar10 = 0;
  uVar12 = (uint)uStack_f0;
  uVar21 = local_e8[1];
  do {
    iVar29 = (uint)(byte)psVar9[lVar10] * iVar31 +
             (uint)*(byte *)((long)psVar9 + lVar10 * 4 + 1) * iVar28 +
             *(byte *)((long)psVar9 + lVar10 * 4 + 2) * local_104;
    if (iVar29 < iVar33) {
      uVar13 = psVar9[lVar10];
      local_f8._0_4_ = uVar13 >> 8;
      local_f8._4_4_ = uVar13 >> 0x10;
      iVar33 = iVar29;
    }
    if (iVar24 < iVar29) {
      uVar12 = psVar9[lVar10];
      uVar21 = uVar12 >> 8;
      uVar34 = uVar12 >> 0x10;
      iVar24 = iVar29;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  iVar28 = (uVar34 & 0xff) * 0x1f;
  iVar31 = (uVar21 & 0xff) * 0x3f;
  iVar33 = (uVar12 & 0xff) * 0x1f;
  uVar12 = iVar33 + (iVar33 + 0x80U >> 8) + 0x80 >> 8;
  uVar30 = ((iVar31 + 0x80U >> 8) + iVar31 + 0x80 >> 3 & 0x1fe0) +
           ((iVar28 + 0x80U >> 8) + iVar28 + 0x80 & 0x1f00) * 8 + uVar12;
  iVar28 = (local_f8._4_4_ & 0xff) * 0x1f;
  iVar31 = (local_f8._0_4_ & 0xff) * 0x3f;
  iVar33 = (uVar13 & 0xff) * 0x1f;
  uVar23 = (iVar33 + 0x80U >> 8) + iVar33 + 0x80 >> 8;
  uVar21 = ((iVar31 + 0x80U >> 8) + iVar31 + 0x80 >> 3 & 0x1fe0) + uVar23;
  uVar34 = uVar21 + ((iVar28 + 0x80U >> 8) + iVar28 + 0x80 & 0x1f00) * 8;
  uVar13 = 0;
  uVar19 = 0;
  local_c8 = (Pixel *)src;
  local_80 = (ushort *)dest;
  if (uVar30 != uVar34) {
    bVar1 = (&Expand5)[uVar30 >> 0xb & 0x1f];
    bVar2 = (&Expand6)[uVar30 >> 5 & 0x3f];
    bVar3 = (&Expand5)[uVar12 & 0x1f];
    local_f8._0_5_ = CONCAT14((&Expand5)[uVar23 & 0x1f],(uint)CONCAT21(CONCAT11(bVar1,bVar2),bVar3))
    ;
    local_f8 = (ulong)CONCAT25(CONCAT11((&Expand5)[uVar34 >> 0xb & 0x1f],
                                        (&Expand6)[uVar21 >> 5 & 0x3f]),(undefined5)local_f8);
    iVar28 = (uint)(byte)(&Expand5)[uVar34 >> 0xb & 0x1f] - (uint)bVar1;
    iVar24 = iVar28 * 0x55;
    iVar33 = (uint)(byte)(&Expand6)[uVar21 >> 5 & 0x3f] - (uint)bVar2;
    iVar29 = iVar33 * 0x55;
    iVar31 = (uint)(byte)(&Expand5)[uVar23 & 0x1f] - (uint)bVar3;
    iVar25 = iVar31 * 0x55;
    uStack_f0 = CONCAT71(CONCAT61(CONCAT51(uStack_f0._3_5_,
                                           (char)(iVar24 + (iVar24 + 0x80U >> 8) + 0x80 >> 8) +
                                           bVar1),
                                  (char)(iVar29 + (iVar29 + 0x80U >> 8) + 0x80 >> 8) + bVar2),
                         (char)(iVar25 + (iVar25 + 0x80U >> 8) + 0x80 >> 8) + bVar3);
    uVar5 = uStack_f0;
    iVar28 = iVar28 * 0xaa;
    uStack_f0._7_1_ = (undefined1)((uint)iVar14 >> 0x18);
    iVar33 = iVar33 * 0xaa;
    iVar31 = iVar31 * 0xaa;
    uStack_f0._0_4_ = (uint)uVar5;
    uStack_f0._0_5_ =
         CONCAT14((char)((iVar31 + 0x80U >> 8) + iVar31 + 0x80 >> 8) + bVar3,(uint)uStack_f0);
    uStack_f0 = CONCAT35(CONCAT21(CONCAT11(uStack_f0._7_1_,
                                           (char)(iVar28 + (iVar28 + 0x80U >> 8) + 0x80 >> 8) +
                                           bVar1),
                                  (char)(iVar33 + (iVar33 + 0x80U >> 8) + 0x80 >> 8) + bVar2),
                         (undefined5)uStack_f0);
    sVar8 = MatchColorsBlock((Pixel *)src,(Pixel *)&local_f8,quality != 0);
    uVar19 = (ulong)sVar8;
  }
  dest = (sU8 *)local_80;
  uVar5 = uStack_f0;
  lVar10 = 0;
  iVar33 = 0;
  iVar28 = 0;
  iVar14 = 0;
  iVar31 = 0;
  iVar29 = 0;
  iVar24 = 0;
  local_cc = (uint)uVar19;
  do {
    uVar32 = (ulong)(((uint)uVar19 & 3) << 2);
    iVar25 = *(int *)((long)crnlib::dxt1_endpoint_optimizer::refine_solution::w1Tab + uVar32);
    uVar13 = uVar13 + *(int *)(RefineBlock(ryg_dxt::Pixel_const*,unsigned_short&,unsigned_short&,unsigned_int)
                               ::prods + uVar32);
    uVar12 = (uint)*(byte *)((long)psVar9 + lVar10 * 4 + 2);
    iVar33 = iVar33 + iVar25 * uVar12;
    uVar21 = (uint)*(byte *)((long)psVar9 + lVar10 * 4 + 1);
    iVar28 = iVar28 + iVar25 * uVar21;
    iVar14 = iVar14 + iVar25 * (uint)(byte)psVar9[lVar10];
    iVar31 = iVar31 + uVar12;
    iVar29 = iVar29 + uVar21;
    iVar24 = iVar24 + (uint)(byte)psVar9[lVar10];
    lVar10 = lVar10 + 1;
    uVar19 = uVar19 >> 2;
  } while (lVar10 != 0x10);
  uVar12 = uVar13 >> 8 & 0xff;
  if (uVar12 == 0 || uVar13 < 0x10000) {
LAB_0019637d:
    bVar36 = false;
    uVar12 = uVar30;
    uVar13 = uVar34;
  }
  else {
    iVar35 = (int)uVar13 >> 0x10;
    uVar13 = uVar13 & 0xff;
    iVar17 = 0;
    iVar25 = uVar12 * iVar35 - uVar13 * uVar13;
    if (iVar25 == 0) goto LAB_0019637d;
    iVar15 = iVar31 * 3 - iVar33;
    iVar29 = iVar29 * 3 - iVar28;
    fVar38 = 0.3647059 / (float)iVar25;
    fVar37 = (fVar38 * 63.0) / 31.0;
    iVar31 = (int)((float)(int)(uVar12 * iVar33 - uVar13 * iVar15) * fVar38 + 0.5);
    iVar24 = iVar24 * 3 - iVar14;
    if (iVar31 < 1) {
      iVar31 = iVar17;
    }
    if (0x1e < iVar31) {
      iVar31 = 0x1f;
    }
    iVar25 = (int)((float)(int)(uVar12 * iVar28 - uVar13 * iVar29) * fVar37 + 0.5);
    if (iVar25 < 1) {
      iVar25 = iVar17;
    }
    if (0x3e < iVar25) {
      iVar25 = 0x3f;
    }
    uVar12 = (uint)((float)(int)(uVar12 * iVar14 - iVar24 * uVar13) * fVar38 + 0.5);
    if ((int)uVar12 < 1) {
      uVar12 = 0;
    }
    if (0x1e < (int)uVar12) {
      uVar12 = 0x1f;
    }
    iVar33 = (int)((float)(int)(iVar15 * iVar35 - iVar33 * uVar13) * fVar38 + 0.5);
    uVar12 = uVar12 | iVar31 << 0xb | iVar25 << 5;
    if (iVar33 < 1) {
      iVar33 = 0;
    }
    if (0x1e < iVar33) {
      iVar33 = 0x1f;
    }
    iVar28 = (int)((float)(int)(iVar29 * iVar35 - iVar28 * uVar13) * fVar37 + 0.5);
    if (iVar28 < 1) {
      iVar28 = iVar17;
    }
    if (0x3e < iVar28) {
      iVar28 = 0x3f;
    }
    uVar21 = (uint)((float)(int)(iVar24 * iVar35 - uVar13 * iVar14) * fVar38 + 0.5);
    uVar13 = 0;
    if (0 < (int)uVar21) {
      uVar13 = uVar21;
    }
    if (0x1e < (int)uVar13) {
      uVar13 = 0x1f;
    }
    uVar13 = uVar13 | iVar33 << 0xb | iVar28 << 5;
    bVar36 = (short)uVar30 != (short)uVar12 || (short)uVar34 != (short)uVar13;
  }
  uVar27 = (ushort)uVar12;
  uVar16 = (ushort)uVar13;
  uVar34 = local_cc;
  if ((bVar36) && (uVar34 = 0, uVar27 != uVar16)) {
    bVar1 = (&Expand5)[(uVar12 & 0xffff) >> 0xb];
    bVar2 = (&Expand6)[(uVar12 & 0xffff) >> 5 & 0x3f];
    bVar3 = (&Expand5)[uVar12 & 0x1f];
    local_f8._0_5_ = CONCAT14((&Expand5)[uVar13 & 0x1f],(uint)CONCAT21(CONCAT11(bVar1,bVar2),bVar3))
    ;
    local_f8 = (ulong)CONCAT25(CONCAT11((&Expand5)[(uVar13 & 0xffff) >> 0xb],
                                        (&Expand6)[(uVar13 & 0xffff) >> 5 & 0x3f]),
                               (undefined5)local_f8);
    iVar29 = (uint)(byte)(&Expand5)[(uVar13 & 0xffff) >> 0xb] - (uint)bVar1;
    iVar28 = iVar29 * 0x55;
    iVar24 = (uint)(byte)(&Expand6)[(uVar13 & 0xffff) >> 5 & 0x3f] - (uint)bVar2;
    iVar31 = iVar24 * 0x55;
    iVar14 = (uint)(byte)(&Expand5)[uVar13 & 0x1f] - (uint)bVar3;
    iVar33 = iVar14 * 0x55;
    uStack_f0 = CONCAT71(CONCAT61(CONCAT51(uStack_f0._3_5_,
                                           (char)(iVar28 + (iVar28 + 0x80U >> 8) + 0x80 >> 8) +
                                           bVar1),
                                  (char)(iVar31 + (iVar31 + 0x80U >> 8) + 0x80 >> 8) + bVar2),
                         (char)(iVar33 + (iVar33 + 0x80U >> 8) + 0x80 >> 8) + bVar3);
    uVar6 = uStack_f0;
    iVar29 = iVar29 * 0xaa;
    uStack_f0._7_1_ = SUB81(uVar5,7);
    iVar24 = iVar24 * 0xaa;
    iVar14 = iVar14 * 0xaa;
    uStack_f0._0_4_ = (uint)uVar6;
    uStack_f0._0_5_ =
         CONCAT14((char)(iVar14 + (iVar14 + 0x80U >> 8) + 0x80 >> 8) + bVar3,(uint)uStack_f0);
    uStack_f0 = CONCAT35(CONCAT21(CONCAT11(uStack_f0._7_1_,
                                           (char)(iVar29 + (iVar29 + 0x80U >> 8) + 0x80 >> 8) +
                                           bVar1),
                                  (char)(iVar24 + (iVar24 + 0x80U >> 8) + 0x80 >> 8) + bVar2),
                         (undefined5)uStack_f0);
    uVar34 = MatchColorsBlock(local_c8,(Pixel *)&local_f8,quality != 0);
  }
LAB_00196688:
  uVar13 = uVar34 ^ 0x55555555;
  uVar4 = uVar16;
  if (uVar16 < uVar27) {
    uVar4 = uVar27;
  }
  if (uVar16 <= uVar27) {
    uVar13 = uVar34;
    uVar27 = uVar16;
  }
  *(ushort *)dest = uVar4;
  *(ushort *)((long)dest + 2) = uVar27;
  *(uint *)((long)dest + 4) = uVar13;
  return;
}

Assistant:

void sCompressDXTBlock(sU8* dest, const sU32* src, sBool alpha, sInt quality) {
  CRNLIB_ASSERT(Expand5[1]);

  // if alpha specified, compress alpha as well
  if (alpha) {
    CompressAlphaBlock(dest, src);
    dest += 8;
  }

  // compress the color part
  CompressColorBlock(dest, src, quality);
}